

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanHppGenerator.cpp
# Opt level: O3

void __thiscall
VulkanHppGenerator::addMissingFlagBits
          (VulkanHppGenerator *this,
          vector<VulkanHppGenerator::RequireData,_std::allocator<VulkanHppGenerator::RequireData>_>
          *requireData,string *requiredBy)

{
  _Base_ptr *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  pointer pNVar3;
  int iVar4;
  iterator iVar5;
  size_type sVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar7;
  iterator iVar8;
  const_iterator cVar9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  string *psVar11;
  undefined8 uVar12;
  pointer __k;
  _Base_ptr this_01;
  pointer pNVar13;
  _Base_ptr __n;
  pointer pRVar14;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  string flagBits;
  vector<VulkanHppGenerator::NameLine,_std::allocator<VulkanHppGenerator::NameLine>_> newTypes;
  allocator_type local_21a;
  less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_219;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,TypeData>,std::_Select1st<std::pair<std::__cxx11::string_const,TypeData>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,TypeData>>>
  *local_1d8;
  _Base_ptr local_1d0;
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,VulkanHppGenerator::EnumData>,std::_Select1st<std::pair<std::__cxx11::string_const,VulkanHppGenerator::EnumData>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,VulkanHppGenerator::EnumData>>>
  *local_1c8;
  pointer local_1c0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::EnumData>
  local_1b8;
  undefined1 local_108 [16];
  _Rb_tree_node_base local_f8;
  string local_d8;
  bool local_b8;
  vector<VulkanHppGenerator::EnumValueAlias,_std::allocator<VulkanHppGenerator::EnumValueAlias>_>
  local_b0;
  vector<VulkanHppGenerator::EnumValueData,_std::allocator<VulkanHppGenerator::EnumValueData>_>
  vStack_98;
  int local_80;
  vector<VulkanHppGenerator::NameLine,_std::allocator<VulkanHppGenerator::NameLine>_> local_78;
  pointer local_60;
  string *local_58;
  _Base_ptr local_50;
  _Base_ptr local_48;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::BitmaskData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::BitmaskData>_>_>
  *local_40;
  pointer local_38;
  
  pRVar14 = (requireData->
            super__Vector_base<VulkanHppGenerator::RequireData,_std::allocator<VulkanHppGenerator::RequireData>_>
            )._M_impl.super__Vector_impl_data._M_start;
  local_60 = (requireData->
             super__Vector_base<VulkanHppGenerator::RequireData,_std::allocator<VulkanHppGenerator::RequireData>_>
             )._M_impl.super__Vector_impl_data._M_finish;
  if (pRVar14 != local_60) {
    local_40 = &this->m_bitmasks;
    local_48 = &(this->m_bitmasks)._M_t._M_impl.super__Rb_tree_header._M_header;
    local_1c8 = (_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,VulkanHppGenerator::EnumData>,std::_Select1st<std::pair<std::__cxx11::string_const,VulkanHppGenerator::EnumData>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,VulkanHppGenerator::EnumData>>>
                 *)&this->m_enums;
    local_50 = &(this->m_enums)._M_t._M_impl.super__Rb_tree_header._M_header;
    local_1d8 = (_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,TypeData>,std::_Select1st<std::pair<std::__cxx11::string_const,TypeData>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,TypeData>>>
                 *)&this->m_types;
    local_1d0 = &(this->m_types)._M_t._M_impl.super__Rb_tree_header._M_header;
    local_58 = requiredBy;
    do {
      local_78.
      super__Vector_base<VulkanHppGenerator::NameLine,_std::allocator<VulkanHppGenerator::NameLine>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_78.
      super__Vector_base<VulkanHppGenerator::NameLine,_std::allocator<VulkanHppGenerator::NameLine>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_78.
      super__Vector_base<VulkanHppGenerator::NameLine,_std::allocator<VulkanHppGenerator::NameLine>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      __k = (pRVar14->types).
            super__Vector_base<VulkanHppGenerator::NameLine,_std::allocator<VulkanHppGenerator::NameLine>_>
            ._M_impl.super__Vector_impl_data._M_start;
      local_38 = (pRVar14->types).
                 super__Vector_base<VulkanHppGenerator::NameLine,_std::allocator<VulkanHppGenerator::NameLine>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      if (__k != local_38) {
        do {
          local_1c0 = pRVar14;
          iVar5 = std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::BitmaskData>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::BitmaskData>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::BitmaskData>_>_>
                  ::find(&local_40->_M_t,&__k->name);
          if (iVar5._M_node != local_48) {
            this_00 = &iVar5._M_node[3]._M_left;
            __n = iVar5._M_node[3]._M_right;
            if (__n == (_Base_ptr)0x0) {
              this_01 = iVar5._M_node + 1;
              sVar6 = std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)this_01,"Flags",0,5);
              if (sVar6 == 0xffffffffffffffff) {
                __assert_fail("pos != std::string::npos",
                              "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp"
                              ,0x259,
                              "void VulkanHppGenerator::addMissingFlagBits(std::vector<RequireData> &, const std::string &)"
                             );
              }
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              substr((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_108,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_01,0,
                     sVar6 + 4);
              pbVar7 = std::__cxx11::
                       basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                                 ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_108,"Bit");
              local_1b8.first._M_dataplus._M_p = (pointer)&local_1b8.first.field_2;
              paVar1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)(pbVar7->_M_dataplus)._M_p;
              paVar10 = &pbVar7->field_2;
              if (paVar1 == paVar10) {
                local_1b8.first.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
                local_1b8.first.field_2._8_8_ = *(undefined8 *)((long)&pbVar7->field_2 + 8);
              }
              else {
                local_1b8.first.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
                local_1b8.first._M_dataplus._M_p = (pointer)paVar1;
              }
              local_1b8.first._M_string_length = pbVar7->_M_string_length;
              (pbVar7->_M_dataplus)._M_p = (pointer)paVar10;
              pbVar7->_M_string_length = 0;
              (pbVar7->field_2)._M_local_buf[0] = '\0';
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              substr(&local_218,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_01,
                     sVar6 + 4,0xffffffffffffffff);
              uVar12 = 0xf;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1b8.first._M_dataplus._M_p != &local_1b8.first.field_2) {
                uVar12 = local_1b8.first.field_2._M_allocated_capacity;
              }
              if ((ulong)uVar12 < local_218._M_string_length + local_1b8.first._M_string_length) {
                uVar12 = 0xf;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_218._M_dataplus._M_p != &local_218.field_2) {
                  uVar12 = local_218.field_2._M_allocated_capacity;
                }
                if ((ulong)uVar12 < local_218._M_string_length + local_1b8.first._M_string_length)
                goto LAB_0010beb0;
                pbVar7 = std::__cxx11::
                         basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
                                   (&local_218,0,0,local_1b8.first._M_dataplus._M_p,
                                    local_1b8.first._M_string_length);
              }
              else {
LAB_0010beb0:
                pbVar7 = std::__cxx11::
                         basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                         _M_append(&local_1b8.first,local_218._M_dataplus._M_p,
                                   local_218._M_string_length);
              }
              local_1f8._M_dataplus._M_p = (pbVar7->_M_dataplus)._M_p;
              paVar1 = &pbVar7->field_2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1f8._M_dataplus._M_p == paVar1) {
                local_1f8.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
                local_1f8.field_2._8_8_ = *(undefined8 *)((long)&pbVar7->field_2 + 8);
                local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
              }
              else {
                local_1f8.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
              }
              local_1f8._M_string_length = pbVar7->_M_string_length;
              (pbVar7->_M_dataplus)._M_p = (pointer)paVar1;
              pbVar7->_M_string_length = 0;
              paVar1->_M_local_buf[0] = '\0';
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_218._M_dataplus._M_p != &local_218.field_2) {
                operator_delete(local_218._M_dataplus._M_p,
                                local_218.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1b8.first._M_dataplus._M_p != &local_1b8.first.field_2) {
                operator_delete(local_1b8.first._M_dataplus._M_p,
                                local_1b8.first.field_2._M_allocated_capacity + 1);
              }
              if ((_Rb_tree_node_base *)local_108._0_8_ != &local_f8) {
                operator_delete((void *)local_108._0_8_,local_f8._0_8_ + 1);
              }
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              _M_assign((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00
                        ,&local_1f8);
              iVar8 = std::
                      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::EnumData>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::EnumData>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::EnumData>_>_>
                      ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::EnumData>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::EnumData>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::EnumData>_>_>
                              *)local_1c8,&local_1f8);
              if (iVar8._M_node == local_50) {
                local_f8._0_8_ = 0;
                local_108._0_8_ = (pointer)0x0;
                local_108._8_8_ = 0;
                local_f8._M_parent = (_Base_ptr)(local_108 + 8);
                local_f8._M_right = (_Rb_tree_node_base *)0x0;
                local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
                local_d8._M_string_length = 0;
                local_d8.field_2._M_local_buf[0] = '\0';
                local_b8 = true;
                vStack_98.
                super__Vector_base<VulkanHppGenerator::EnumValueData,_std::allocator<VulkanHppGenerator::EnumValueData>_>
                ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                vStack_98.
                super__Vector_base<VulkanHppGenerator::EnumValueData,_std::allocator<VulkanHppGenerator::EnumValueData>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                local_b0.
                super__Vector_base<VulkanHppGenerator::EnumValueAlias,_std::allocator<VulkanHppGenerator::EnumValueAlias>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                vStack_98.
                super__Vector_base<VulkanHppGenerator::EnumValueData,_std::allocator<VulkanHppGenerator::EnumValueData>_>
                ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                local_b0.
                super__Vector_base<VulkanHppGenerator::EnumValueAlias,_std::allocator<VulkanHppGenerator::EnumValueAlias>_>
                ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                local_b0.
                super__Vector_base<VulkanHppGenerator::EnumValueAlias,_std::allocator<VulkanHppGenerator::EnumValueAlias>_>
                ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                local_80 = 0;
                local_f8._M_left = local_f8._M_parent;
                std::
                pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::EnumData>
                ::
                pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_VulkanHppGenerator::EnumData,_true>
                          (&local_1b8,&local_1f8,(EnumData *)local_108);
                std::
                _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,VulkanHppGenerator::EnumData>,std::_Select1st<std::pair<std::__cxx11::string_const,VulkanHppGenerator::EnumData>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,VulkanHppGenerator::EnumData>>>
                ::
                _M_insert_unique<std::pair<std::__cxx11::string_const,VulkanHppGenerator::EnumData>>
                          (local_1c8,&local_1b8);
                std::
                vector<VulkanHppGenerator::EnumValueData,_std::allocator<VulkanHppGenerator::EnumValueData>_>
                ::~vector(&local_1b8.second.values);
                std::
                vector<VulkanHppGenerator::EnumValueAlias,_std::allocator<VulkanHppGenerator::EnumValueAlias>_>
                ::~vector(&local_1b8.second.valueAliases);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1b8.second.bitwidth._M_dataplus._M_p !=
                    &local_1b8.second.bitwidth.field_2) {
                  operator_delete(local_1b8.second.bitwidth._M_dataplus._M_p,
                                  local_1b8.second.bitwidth.field_2._M_allocated_capacity + 1);
                }
                std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                             *)&local_1b8.second);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1b8.first._M_dataplus._M_p != &local_1b8.first.field_2) {
                  operator_delete(local_1b8.first._M_dataplus._M_p,
                                  local_1b8.first.field_2._M_allocated_capacity + 1);
                }
                std::
                vector<VulkanHppGenerator::EnumValueData,_std::allocator<VulkanHppGenerator::EnumValueData>_>
                ::~vector(&vStack_98);
                std::
                vector<VulkanHppGenerator::EnumValueAlias,_std::allocator<VulkanHppGenerator::EnumValueAlias>_>
                ::~vector(&local_b0);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
                  operator_delete(local_d8._M_dataplus._M_p,
                                  CONCAT71(local_d8.field_2._M_allocated_capacity._1_7_,
                                           local_d8.field_2._M_local_buf[0]) + 1);
                }
                std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                             *)local_108);
                cVar9 = std::
                        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeData>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeData>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeData>_>_>
                        ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeData>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeData>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeData>_>_>
                                *)local_1d8,&local_1f8);
                if (cVar9._M_node != local_1d0) {
                  __assert_fail("!m_types.contains( flagBits )",
                                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp"
                                ,0x265,
                                "void VulkanHppGenerator::addMissingFlagBits(std::vector<RequireData> &, const std::string &)"
                               );
                }
                local_108._0_8_ = local_108._0_8_ & 0xffffffff00000000;
                local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
                pcVar2 = (local_58->_M_dataplus)._M_p;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_218,pcVar2,pcVar2 + local_58->_M_string_length);
                __l._M_len = 1;
                __l._M_array = &local_218;
                std::
                set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)(local_108 + 8),__l,&local_219,&local_21a);
                local_d8._M_string_length = local_d8._M_string_length & 0xffffffff00000000;
                local_1b8.first._M_dataplus._M_p = (pointer)&local_1b8.first.field_2;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_1b8,local_1f8._M_dataplus._M_p,
                           local_1f8._M_dataplus._M_p + local_1f8._M_string_length);
                local_1b8.second.aliases._M_t._M_impl._0_4_ = local_108._0_4_;
                if (local_f8._M_parent == (_Rb_tree_node_base *)0x0) {
                  local_1b8.second.aliases._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                       (_Rb_tree_node_base *)0x0;
                  local_1b8.second.aliases._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                       (_Base_ptr)
                       ((long)&local_1b8.second.aliases._M_t._M_impl.super__Rb_tree_header + 8);
                  local_1b8.second.aliases._M_t._M_impl.super__Rb_tree_header._M_header._M_parent.
                  _0_4_ = 0;
                  psVar11 = &local_1b8.second.bitwidth;
                  local_1b8.second.aliases._M_t._M_impl.super__Rb_tree_header._M_node_count =
                       (size_t)local_1b8.second.aliases._M_t._M_impl.super__Rb_tree_header._M_header
                               ._M_right;
                }
                else {
                  local_1b8.second.aliases._M_t._M_impl.super__Rb_tree_header._M_header._M_parent.
                  _0_4_ = local_f8._M_color;
                  local_1b8.second.aliases._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                       local_f8._M_parent;
                  local_1b8.second.aliases._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                       local_f8._M_left;
                  local_1b8.second.aliases._M_t._M_impl.super__Rb_tree_header._M_node_count =
                       (size_t)local_f8._M_right;
                  *(_Base_ptr *)((long)local_f8._M_parent + 8) =
                       (_Base_ptr)
                       ((long)&local_1b8.second.aliases._M_t._M_impl.super__Rb_tree_header + 8);
                  local_1b8.second.bitwidth._M_dataplus._M_p = local_d8._M_dataplus._M_p;
                  local_f8._M_parent = (_Rb_tree_node_base *)0x0;
                  local_f8._M_left = &local_f8;
                  psVar11 = &local_d8;
                  local_f8._M_right = local_f8._M_left;
                }
                (psVar11->_M_dataplus)._M_p = (pointer)0x0;
                local_1b8.second.bitwidth._M_string_length._0_4_ =
                     (undefined4)local_d8._M_string_length;
                std::
                _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,TypeData>,std::_Select1st<std::pair<std::__cxx11::string_const,TypeData>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,TypeData>>>
                ::_M_insert_unique<std::pair<std::__cxx11::string_const,TypeData>>
                          (local_1d8,
                           (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeData>
                            *)&local_1b8);
                std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)&local_1b8.second.aliases._M_t._M_impl.super__Rb_tree_header);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1b8.first._M_dataplus._M_p != &local_1b8.first.field_2) {
                  operator_delete(local_1b8.first._M_dataplus._M_p,
                                  local_1b8.first.field_2._M_allocated_capacity + 1);
                }
                std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)(local_108 + 8));
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_218._M_dataplus._M_p != &local_218.field_2) {
                  operator_delete(local_218._M_dataplus._M_p,
                                  local_218.field_2._M_allocated_capacity + 1);
                }
              }
              else {
                cVar9 = std::
                        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeData>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeData>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeData>_>_>
                        ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeData>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeData>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeData>_>_>
                                *)local_1d8,&local_1f8);
                if (cVar9._M_node == local_1d0) {
                  __assert_fail("m_types.contains( flagBits )",
                                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp"
                                ,0x26a,
                                "void VulkanHppGenerator::addMissingFlagBits(std::vector<RequireData> &, const std::string &)"
                               );
                }
                *(undefined1 *)&iVar8._M_node[4]._M_left = 1;
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
                operator_delete(local_1f8._M_dataplus._M_p,
                                local_1f8.field_2._M_allocated_capacity + 1);
              }
              __n = iVar5._M_node[3]._M_right;
            }
            pNVar3 = (local_1c0->types).
                     super__Vector_base<VulkanHppGenerator::NameLine,_std::allocator<VulkanHppGenerator::NameLine>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            for (pNVar13 = (local_1c0->types).
                           super__Vector_base<VulkanHppGenerator::NameLine,_std::allocator<VulkanHppGenerator::NameLine>_>
                           ._M_impl.super__Vector_impl_data._M_start; pNVar13 != pNVar3;
                pNVar13 = pNVar13 + 1) {
              if ((__n == (_Base_ptr)(pNVar13->name)._M_string_length) &&
                 ((__n == (_Base_ptr)0x0 ||
                  (iVar4 = bcmp((pNVar13->name)._M_dataplus._M_p,*this_00,(size_t)__n), iVar4 == 0))
                 )) goto LAB_0010c397;
            }
            local_1b8.first._M_dataplus._M_p = (pointer)&local_1b8.first.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_1b8,*this_00,(long)&__n->_M_color + (long)*this_00);
            local_1b8.second.aliases._M_t._M_impl._0_4_ = *(undefined4 *)&iVar5._M_node[5]._M_left;
            std::vector<VulkanHppGenerator::NameLine,_std::allocator<VulkanHppGenerator::NameLine>_>
            ::emplace_back<VulkanHppGenerator::NameLine>(&local_78,(NameLine *)&local_1b8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1b8.first._M_dataplus._M_p != &local_1b8.first.field_2) {
              operator_delete(local_1b8.first._M_dataplus._M_p,
                              local_1b8.first.field_2._M_allocated_capacity + 1);
            }
          }
LAB_0010c397:
          __k = __k + 1;
          pRVar14 = local_1c0;
        } while (__k != local_38);
        __k = (local_1c0->types).
              super__Vector_base<VulkanHppGenerator::NameLine,_std::allocator<VulkanHppGenerator::NameLine>_>
              ._M_impl.super__Vector_impl_data._M_finish;
      }
      std::vector<VulkanHppGenerator::NameLine,std::allocator<VulkanHppGenerator::NameLine>>::
      _M_range_insert<__gnu_cxx::__normal_iterator<VulkanHppGenerator::NameLine*,std::vector<VulkanHppGenerator::NameLine,std::allocator<VulkanHppGenerator::NameLine>>>>
                ((vector<VulkanHppGenerator::NameLine,std::allocator<VulkanHppGenerator::NameLine>>
                  *)&pRVar14->types,__k,
                 local_78.
                 super__Vector_base<VulkanHppGenerator::NameLine,_std::allocator<VulkanHppGenerator::NameLine>_>
                 ._M_impl.super__Vector_impl_data._M_start,
                 local_78.
                 super__Vector_base<VulkanHppGenerator::NameLine,_std::allocator<VulkanHppGenerator::NameLine>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
      std::vector<VulkanHppGenerator::NameLine,_std::allocator<VulkanHppGenerator::NameLine>_>::
      ~vector(&local_78);
      pRVar14 = pRVar14 + 1;
    } while (pRVar14 != local_60);
  }
  return;
}

Assistant:

void VulkanHppGenerator::addMissingFlagBits( std::vector<RequireData> & requireData, std::string const & requiredBy )
{
  for ( auto & require : requireData )
  {
    std::vector<NameLine> newTypes;
    for ( auto const & type : require.types )
    {
      auto bitmaskIt = m_bitmasks.find( type.name );
      if ( bitmaskIt != m_bitmasks.end() )
      {
        if ( bitmaskIt->second.require.empty() )
        {
          // generate the flagBits enum name out of the bitmask name: VkFooFlagsXXX -> VkFooFlagBitsXXX
          const size_t pos = bitmaskIt->first.find( "Flags" );
          assert( pos != std::string::npos );
          std::string flagBits = bitmaskIt->first.substr( 0, pos + 4 ) + "Bit" + bitmaskIt->first.substr( pos + 4 );

          bitmaskIt->second.require = flagBits;

          // some flagsBits are specified but never listed as required for any flags!
          // so, even if this bitmask has no enum listed as required, it might still already exist in the enums list
          auto enumIt = m_enums.find( flagBits );
          if ( enumIt == m_enums.end() )
          {
            m_enums.insert( { flagBits, EnumData{ .isBitmask = true, .xmlLine = 0 } } );

            assert( !m_types.contains( flagBits ) );
            m_types.insert( { flagBits, TypeData{ TypeCategory::Bitmask, { requiredBy }, 0 } } );
          }
          else
          {
            assert( m_types.contains( flagBits ) );
            enumIt->second.isBitmask = true;
          }
        }
        if ( std::ranges::none_of( require.types, [bitmaskIt]( auto const & requireType ) { return requireType.name == bitmaskIt->second.require; } ) )
        {
          // this bitmask requires a flags type that is not listed in here, so add it
          newTypes.push_back( { bitmaskIt->second.require, bitmaskIt->second.xmlLine } );
        }
      }
    }
    // add all the newly created flagBits types to the require list as if they had been part of the vk.xml!
    require.types.insert( require.types.end(), newTypes.begin(), newTypes.end() );
  }
}